

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int lyxp_node_atomize(lys_node *node,lyxp_set *set,int warn_on_fwd_ref)

{
  LYS_NODE LVar1;
  lyxp_set *plVar2;
  int iVar3;
  uint8_t *puVar4;
  LY_ERR *pLVar5;
  LY_VECODE *pLVar6;
  lys_node *plVar7;
  ulong uVar8;
  uint uVar9;
  lys_node *plVar10;
  char *pcVar11;
  bool bVar12;
  lyxp_node_type local_8c;
  lys_node *plStack_88;
  lyxp_node_type ctx_snode_type;
  ulong local_80;
  lyxp_set local_78;
  lys_node *local_48;
  lyxp_set *local_40;
  uint local_38;
  int local_34;
  
  local_40 = set;
  local_34 = warn_on_fwd_ref;
  if ((warn_on_fwd_ref != 0) && (puVar4 = ly_vlog_hide_location(), *puVar4 != '\0')) {
    __assert_fail("!warn_on_fwd_ref || !*ly_vlog_hide_location()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                  ,0x1dfe,"int lyxp_node_atomize(const struct lys_node *, struct lyxp_set *, int)");
  }
  local_78.used = 0;
  local_78.size = 0;
  local_78.ctx_pos = 0;
  local_78.ctx_size = 0;
  local_78.val.nodes = (lyxp_set_nodes *)0x0;
  local_78.val._8_8_ = 0;
  local_78.type = LYXP_SET_EMPTY;
  local_78._4_4_ = 0;
  local_78._8_8_ = 0;
  local_40->used = 0;
  local_40->size = 0;
  local_40->ctx_pos = 0;
  local_40->ctx_size = 0;
  (local_40->val).nodes = (lyxp_set_nodes *)0x0;
  *(undefined8 *)((long)&local_40->val + 8) = 0;
  *(undefined8 *)local_40 = 0;
  *(undefined8 *)&local_40->field_0x8 = 0;
  local_38 = 0;
  local_48 = node;
  if (node != (lys_node *)0x0) {
    do {
      if (local_48->nodetype == LYS_OUTPUT) {
        local_38 = 0x20;
        break;
      }
      local_48 = lys_parent(local_48);
    } while (local_48 != (lys_node *)0x0);
  }
  LVar1 = node->nodetype;
  plVar7 = (lys_node *)0x0;
  uVar8 = 0;
  if ((int)LVar1 < 0x80) {
    if ((int)LVar1 < 0x10) {
      plVar10 = (lys_node *)0x0;
      switch(LVar1) {
      case LYS_CONTAINER:
        plVar7 = (lys_node *)node[1].name;
        plVar10 = (lys_node *)node[1].dsc;
        uVar8 = (ulong)node->padding[2];
        break;
      case LYS_CHOICE:
switchD_00168865_caseD_2:
        plVar7 = (lys_node *)node[1].name;
      default:
switchD_00168865_default:
        plVar10 = (lys_node *)0x0;
        uVar8 = 0;
        break;
      case LYS_CHOICE|LYS_CONTAINER:
      case LYS_LEAF|LYS_CONTAINER:
      case LYS_LEAF|LYS_CHOICE:
      case LYS_LEAF|LYS_CHOICE|LYS_CONTAINER:
        break;
      case LYS_LEAF:
      case LYS_LEAFLIST:
switchD_00168865_caseD_4:
        plVar10 = (lys_node *)node[1].dsc;
        plVar7 = (lys_node *)node[1].name;
        uVar8 = (ulong)node->padding[3];
      }
    }
    else if (LVar1 == LYS_LIST) {
      plVar10 = (lys_node *)node[1].dsc;
      plVar7 = (lys_node *)node[1].name;
      uVar8 = (ulong)node->padding[0];
    }
    else {
      if (LVar1 == LYS_ANYXML) goto switchD_00168865_caseD_4;
      plVar10 = (lys_node *)0x0;
      if (LVar1 == LYS_CASE) goto switchD_00168865_caseD_2;
    }
  }
  else {
    plVar7 = (lys_node *)0x0;
    if ((int)LVar1 < 0x1000) {
      if (((LVar1 == LYS_NOTIF) || (LVar1 == LYS_INPUT)) ||
         (plVar10 = (lys_node *)0x0, LVar1 == LYS_OUTPUT)) {
        plVar10 = (lys_node *)node[1].dsc;
        plVar7 = (lys_node *)0x0;
        uVar8 = (ulong)node->padding[3];
      }
    }
    else {
      if (LVar1 == LYS_USES) goto switchD_00168865_caseD_2;
      if (LVar1 == LYS_AUGMENT) {
        plVar7 = node->next;
        goto switchD_00168865_default;
      }
      plVar10 = (lys_node *)0x0;
      uVar8 = 0;
      if (LVar1 == LYS_ANYDATA) goto switchD_00168865_caseD_4;
    }
  }
  if (local_34 != 0) {
    ly_vlog_hide('\x01');
  }
  plStack_88 = plVar10;
  if (plVar7 == (lys_node *)0x0) {
    uVar9 = 0;
  }
  else {
    resolve_when_ctx_snode(node,&local_48,&local_8c);
    iVar3 = lyxp_atomize(plVar7->name,local_48,local_8c,&local_78,local_38 | 0x10);
    if (iVar3 != 0) {
      free(local_78.val.nodes);
      pLVar5 = ly_errno_location();
      uVar9 = 0xffffffff;
      pcVar11 = "Invalid when condition \"%s\".";
      if (*pLVar5 == LY_EVALID) {
        pLVar6 = ly_vecode_location();
        if (*pLVar6 == LYVE_XPATH_INSNODE) {
          if (local_34 != 0) {
LAB_001689e2:
            local_80 = uVar8;
            ly_vlog_hide('\0');
            if ('\0' < ly_log_level) {
              pcVar11 = ly_errmsg();
              ly_log(LY_LLWRN,pcVar11);
            }
            pcVar11 = lys_path(node);
            if ('\0' < ly_log_level) {
              ly_log(LY_LLWRN,"Invalid when condition \"%s\". (%s)",plVar7->name,pcVar11);
            }
            free(pcVar11);
            uVar9 = 1;
            ly_vlog_hide('\x01');
            uVar8 = local_80;
            goto LAB_00168a56;
          }
          uVar9 = 1;
        }
        else {
          bVar12 = local_34 != 0;
          pLVar6 = ly_vecode_location();
          pcVar11 = "Invalid when condition \"%s\".";
          if (bVar12 && *pLVar6 == LYVE_XPATH_INMOD) goto LAB_001689e2;
          uVar9 = -(uint)(*pLVar6 != LYVE_XPATH_INMOD) | 1;
        }
      }
LAB_00168b88:
      ly_vlog(LYE_SPEC,LY_VLOG_LYS,node,pcVar11,plVar7->name);
      goto LAB_00168ba2;
    }
    set_snode_merge(local_40,&local_78);
    uVar9 = 0;
LAB_00168a56:
    local_78.used = 0;
    local_78.size = 0;
    local_78.ctx_pos = 0;
    local_78.ctx_size = 0;
    local_78.val.nodes = (lyxp_set_nodes *)0x0;
    local_78.val._8_8_ = 0;
    local_78.type = LYXP_SET_EMPTY;
    local_78._4_4_ = 0;
    local_78._8_8_ = 0;
  }
  if ((char)uVar8 != '\0') {
    local_38 = local_38 | 8;
    uVar8 = uVar8 & 0xff;
    plVar7 = plStack_88;
    do {
      iVar3 = lyxp_atomize(plVar7->name,node,LYXP_NODE_ELEM,&local_78,local_38);
      if (iVar3 != 0) {
        free(local_78.val.nodes);
        pLVar5 = ly_errno_location();
        if (*pLVar5 == LY_EVALID) {
          pLVar6 = ly_vecode_location();
          if ((*pLVar6 == LYVE_XPATH_INSNODE) && (local_34 != 0)) {
            ly_vlog_hide('\0');
            if ('\0' < ly_log_level) {
              pcVar11 = ly_errmsg();
              ly_log(LY_LLWRN,pcVar11);
            }
            pcVar11 = lys_path(node);
            if ('\0' < ly_log_level) {
              ly_log(LY_LLWRN,"Invalid must restriction \"%s\". (%s)",plVar7->name,pcVar11);
            }
            free(pcVar11);
            uVar9 = 1;
            ly_vlog_hide('\x01');
            goto LAB_00168b4b;
          }
          uVar9 = (uint)(*pLVar6 == LYVE_XPATH_INSNODE) * 2 - 1;
        }
        else {
          uVar9 = 0xffffffff;
        }
        pcVar11 = "Invalid must restriction \"%s\".";
        goto LAB_00168b88;
      }
      set_snode_merge(local_40,&local_78);
LAB_00168b4b:
      local_78.used = 0;
      local_78.size = 0;
      local_78.ctx_pos = 0;
      local_78.ctx_size = 0;
      local_78.val.nodes = (lyxp_set_nodes *)0x0;
      local_78.val._8_8_ = 0;
      local_78.type = LYXP_SET_EMPTY;
      local_78._4_4_ = 0;
      local_78._8_8_ = 0;
      plVar7 = (lys_node *)&plVar7->nodetype;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
LAB_00168ba2:
  if (local_34 != 0) {
    ly_vlog_hide('\0');
  }
  plVar2 = local_40;
  if (uVar9 != 0) {
    free((local_40->val).nodes);
    plVar2->used = 0;
    plVar2->size = 0;
    plVar2->ctx_pos = 0;
    plVar2->ctx_size = 0;
    (plVar2->val).nodes = (lyxp_set_nodes *)0x0;
    *(undefined8 *)((long)&plVar2->val + 8) = 0;
    *(undefined8 *)plVar2 = 0;
    *(undefined8 *)&plVar2->field_0x8 = 0;
  }
  return uVar9;
}

Assistant:

int
lyxp_node_atomize(const struct lys_node *node, struct lyxp_set *set, int warn_on_fwd_ref)
{
    struct lys_node *ctx_snode;
    enum lyxp_node_type ctx_snode_type;
    struct lyxp_set tmp_set;
    uint8_t must_size = 0;
    uint32_t i;
    int opts, ret = EXIT_SUCCESS;
    struct lys_when *when = NULL;
    struct lys_restr *must = NULL;
    char *path;

    assert(!warn_on_fwd_ref || !*ly_vlog_hide_location());

    memset(&tmp_set, 0, sizeof tmp_set);
    memset(set, 0, sizeof *set);

    /* check if we will be traversing RPC output */
    opts = 0;
    for (ctx_snode = (struct lys_node *)node; ctx_snode && (ctx_snode->nodetype != LYS_OUTPUT); ctx_snode = lys_parent(ctx_snode));
    if (ctx_snode) {
        opts |= LYXP_SNODE_OUTPUT;
    }

    switch (node->nodetype) {
    case LYS_CONTAINER:
        when = ((struct lys_node_container *)node)->when;
        must = ((struct lys_node_container *)node)->must;
        must_size = ((struct lys_node_container *)node)->must_size;
        break;
    case LYS_CHOICE:
        when = ((struct lys_node_choice *)node)->when;
        break;
    case LYS_LEAF:
        when = ((struct lys_node_leaf *)node)->when;
        must = ((struct lys_node_leaf *)node)->must;
        must_size = ((struct lys_node_leaf *)node)->must_size;
        break;
    case LYS_LEAFLIST:
        when = ((struct lys_node_leaflist *)node)->when;
        must = ((struct lys_node_leaflist *)node)->must;
        must_size = ((struct lys_node_leaflist *)node)->must_size;
        break;
    case LYS_LIST:
        when = ((struct lys_node_list *)node)->when;
        must = ((struct lys_node_list *)node)->must;
        must_size = ((struct lys_node_list *)node)->must_size;
        break;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        when = ((struct lys_node_anydata *)node)->when;
        must = ((struct lys_node_anydata *)node)->must;
        must_size = ((struct lys_node_anydata *)node)->must_size;
        break;
    case LYS_CASE:
        when = ((struct lys_node_case *)node)->when;
        break;
    case LYS_NOTIF:
        must = ((struct lys_node_notif *)node)->must;
        must_size = ((struct lys_node_notif *)node)->must_size;
        break;
    case LYS_INPUT:
    case LYS_OUTPUT:
        must = ((struct lys_node_inout *)node)->must;
        must_size = ((struct lys_node_inout *)node)->must_size;
        break;
    case LYS_USES:
        when = ((struct lys_node_uses *)node)->when;
        break;
    case LYS_AUGMENT:
        when = ((struct lys_node_augment *)node)->when;
        break;
    default:
        /* nothing to check */
        break;
    }

    if (warn_on_fwd_ref) {
        /* hide errors, we can print only warnings */
        ly_vlog_hide(1);
    }

    /* check "when" */
    if (when) {
        resolve_when_ctx_snode(node, &ctx_snode, &ctx_snode_type);
        if (lyxp_atomize(when->cond, ctx_snode, ctx_snode_type, &tmp_set, LYXP_SNODE_WHEN | opts)) {
            free(tmp_set.val.snodes);
            if ((ly_errno != LY_EVALID) || ((ly_vecode != LYVE_XPATH_INSNODE) && (ly_vecode != LYVE_XPATH_INMOD))) {
                LOGVAL(LYE_SPEC, LY_VLOG_LYS, node, "Invalid when condition \"%s\".", when->cond);
                ret = -1;
                goto finish;
            } else if (!warn_on_fwd_ref) {
                LOGVAL(LYE_SPEC, LY_VLOG_LYS, node, "Invalid when condition \"%s\".", when->cond);
                ret = EXIT_FAILURE;
                goto finish;
            }
            ly_vlog_hide(0);
            LOGWRN(ly_errmsg());
            path = lys_path(node);
            LOGWRN("Invalid when condition \"%s\". (%s)", when->cond, path);
            free(path);
            ly_vlog_hide(1);

            ret = EXIT_FAILURE;
            memset(&tmp_set, 0, sizeof tmp_set);
        } else {
            set_snode_merge(set, &tmp_set);
            memset(&tmp_set, 0, sizeof tmp_set);
        }
    }

    /* check "must" */
    for (i = 0; i < must_size; ++i) {
        if (lyxp_atomize(must[i].expr, node, LYXP_NODE_ELEM, &tmp_set, LYXP_SNODE_MUST | opts)) {
            free(tmp_set.val.snodes);
            if ((ly_errno != LY_EVALID) || (ly_vecode != LYVE_XPATH_INSNODE)) {
                LOGVAL(LYE_SPEC, LY_VLOG_LYS, node, "Invalid must restriction \"%s\".", must[i].expr);
                ret = -1;
                goto finish;
            } else if (!warn_on_fwd_ref) {
                LOGVAL(LYE_SPEC, LY_VLOG_LYS, node, "Invalid must restriction \"%s\".", must[i].expr);
                ret = EXIT_FAILURE;
                goto finish;
            }
            ly_vlog_hide(0);
            LOGWRN(ly_errmsg());
            path = lys_path(node);
            LOGWRN("Invalid must restriction \"%s\". (%s)", must[i].expr, path);
            free(path);
            ly_vlog_hide(1);

            ret = EXIT_FAILURE;
            memset(&tmp_set, 0, sizeof tmp_set);
        } else {
            set_snode_merge(set, &tmp_set);
            memset(&tmp_set, 0, sizeof tmp_set);
        }
    }

finish:
    if (warn_on_fwd_ref) {
        ly_vlog_hide(0);
    }
    if (ret) {
        free(set->val.snodes);
        memset(set, 0, sizeof *set);
    }
    return ret;
}